

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void helics::apps::setGeneratorProperty(SignalGenerator *gen,string_view name,json *prop)

{
  double dVar1;
  bool bVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_RDI;
  __sv_type _Var3;
  invalid_argument *anon_var_0;
  Time time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  size_t local_88;
  char *local_80;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffb0;
  time_units defaultUnits;
  json *in_stack_ffffffffffffffb8;
  TimeRepresentation<count_time<9,_long>_> local_38;
  undefined8 local_30;
  undefined8 local_28;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *local_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  defaultUnits = (time_units)((ulong)in_stack_ffffffffffffffb0.internalTimeCode >> 0x20);
  local_18 = in_RDI;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  bVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::is_number((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffee0);
  if (bVar2) {
    local_30 = local_10;
    local_28 = uStack_8;
    dVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<double,double>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffee0);
    (**(code **)(*(long *)&local_18->m_data + 0x10))(SUB84(dVar1,0),local_18,local_30,local_28);
  }
  else {
    local_38.internalTimeCode =
         (baseType)fileops::loadJsonTime(in_stack_ffffffffffffffb8,defaultUnits);
    TimeRepresentation<count_time<9,_long>_>::minVal();
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                      (&local_38,
                       (TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffb0);
    if (bVar2) {
      dVar1 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x237e6c);
      (**(code **)(*(long *)&local_18->m_data + 0x10))(SUB84(dVar1,0),local_18,local_10,uStack_8);
    }
    else {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::get<std::__cxx11::string,std::__cxx11::string>(local_18);
      _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffee0);
      local_88 = _Var3._M_len;
      local_80 = _Var3._M_str;
      (**(code **)(*(long *)&local_18->m_data + 0x18))(local_18,local_10,uStack_8,local_88,local_80)
      ;
      std::__cxx11::string::~string(in_stack_fffffffffffffee0);
    }
  }
  return;
}

Assistant:

static void setGeneratorProperty(SignalGenerator* gen,
                                     std::string_view name,
                                     const nlohmann::json& prop)
    {
        if (prop.is_number()) {
            gen->set(name, prop.get<double>());
        } else {
            try {
                auto time = fileops::loadJsonTime(prop);
                if (time > Time::minVal()) {
                    gen->set(name, static_cast<double>(time));
                } else {
                    gen->setString(name, prop.get<std::string>());
                }
            }
            catch (const std::invalid_argument&) {
                gen->setString(name, prop.get<std::string>());
            }
        }
    }